

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O3

void Jf_ManComputeCuts(Jf_Man_t *p,int fEdge)

{
  Jf_Par_t *pJVar1;
  uint uVar2;
  int iVar3;
  Gia_Man_t *pGVar4;
  undefined8 uVar5;
  uint uVar6;
  uint uVar7;
  Gia_Obj_t *pObj;
  long lVar8;
  int iVar9;
  long lVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  timespec ts;
  timespec local_48;
  Vec_Set_t *local_38;
  
  if (p->pPars->fVerbose != 0) {
    pGVar4 = p->pGia;
    uVar2 = pGVar4->vCis->nSize;
    uVar6 = pGVar4->vCos->nSize;
    printf("Aig: CI = %d  CO = %d  AND = %d    ",(ulong)uVar2,(ulong)uVar6,
           (ulong)(~(uVar6 + uVar2) + pGVar4->nObjs));
    pJVar1 = p->pPars;
    printf("LutSize = %d  CutMax = %d  Rounds = %d\n",(ulong)(uint)pJVar1->nLutSize,
           (ulong)(uint)pJVar1->nCutNum,(ulong)(uint)pJVar1->nRounds);
    printf("Computing cuts...\r");
    fflush(_stdout);
  }
  pGVar4 = p->pGia;
  if (0 < pGVar4->nObjs) {
    local_38 = &p->pMem;
    lVar10 = 0;
    iVar9 = 0;
    lVar8 = 0;
    do {
      if (pGVar4->pObjs == (Gia_Obj_t *)0x0) break;
      pObj = (Gia_Obj_t *)(&pGVar4->pObjs->field_0x0 + lVar10);
      uVar5 = *(undefined8 *)pObj;
      uVar2 = (uint)uVar5;
      if ((uVar2 & 0x9fffffff) == 0x9fffffff) {
LAB_0075c688:
        local_48.tv_sec = 0x20100000001;
        uVar2 = (uint)*(undefined8 *)pObj;
        local_48.tv_nsec._0_4_ = iVar9;
        if (((uVar2 & 0x9fffffff) != 0x9fffffff) &&
           ((((int)uVar2 < 0 || ((uVar2 & 0x1fffffff) == 0x1fffffff)) ||
            ((uVar2 & 0x1fffffff) != ((uint)((ulong)*(undefined8 *)pObj >> 0x20) & 0x1fffffff))))) {
          __assert_fail("Gia_ObjIsCi(pObj) || Gia_ObjIsBuf(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaJf.c"
                        ,0x451,"void Jf_ObjAssignCut(Jf_Man_t *, Gia_Obj_t *)");
        }
        iVar3 = Vec_SetAppend(local_38,(int *)&local_48,3);
        if ((p->vCuts).nSize <= lVar8) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        (p->vCuts).pArray[lVar8] = iVar3;
        uVar5 = *(undefined8 *)pObj;
        uVar6 = (uint)uVar5 & 0x1fffffff;
        uVar7 = (uint)((ulong)uVar5 >> 0x20) & 0x1fffffff;
      }
      else {
        uVar6 = uVar2 & 0x1fffffff;
        uVar7 = (uint)((ulong)uVar5 >> 0x20) & 0x1fffffff;
        if (((-1 < (int)uVar2) && (uVar6 != 0x1fffffff)) && (uVar6 == uVar7)) goto LAB_0075c688;
      }
      uVar2 = (uint)uVar5;
      if (((-1 < (int)uVar2) && (uVar6 != 0x1fffffff)) && (uVar6 == uVar7)) {
        Gia_ObjId(p->pGia,pObj);
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaJf.c"
                      ,0x458,"void Jf_ObjPropagateBuf(Jf_Man_t *, Gia_Obj_t *, int)");
      }
      if ((~uVar2 & 0x1fffffff) != 0 && -1 < (int)uVar2) {
        Jf_ObjComputeCuts(p,pObj,fEdge);
      }
      lVar8 = lVar8 + 1;
      pGVar4 = p->pGia;
      iVar9 = iVar9 + 2;
      lVar10 = lVar10 + 0xc;
    } while (lVar8 < pGVar4->nObjs);
  }
  if (p->pPars->fVerbose != 0) {
    printf("CutPair = %lu  ",p->CutCount[0]);
    printf("Merge = %lu  ",p->CutCount[1]);
    printf("Eval = %lu  ",p->CutCount[2]);
    printf("Cut = %lu  ",p->CutCount[3]);
    iVar3 = 3;
    iVar9 = clock_gettime(3,&local_48);
    if (iVar9 < 0) {
      lVar8 = -1;
    }
    else {
      lVar8 = CONCAT44(local_48.tv_nsec._4_4_,(int)local_48.tv_nsec) / 1000 +
              local_48.tv_sec * 1000000;
    }
    lVar10 = p->clkStart;
    Abc_Print(iVar3,"%s =","Time");
    Abc_Print(iVar3,"%9.2f sec\n",(double)(lVar8 - lVar10) / 1000000.0);
    printf("Memory:  ");
    dVar11 = Gia_ManMemory(p->pGia);
    printf("Gia = %.2f MB  ",dVar11 * 9.5367431640625e-07);
    printf("Man = %.2f MB  ",(double)p->pGia->nObjs * 24.0 * 9.5367431640625e-07);
    lVar8 = (long)(p->pMem).nPagesAlloc << 3;
    auVar12._8_4_ = (int)((ulong)lVar8 >> 0x20);
    auVar12._0_8_ = lVar8;
    auVar12._12_4_ = 0x45300000;
    lVar10 = ((long)(p->pMem).iPage + 1) * (8L << ((byte)(p->pMem).nPageSize & 0x3f));
    auVar13._8_4_ = (int)((ulong)lVar10 >> 0x20);
    auVar13._0_8_ = lVar10;
    auVar13._12_4_ = 0x45300000;
    printf("Cuts = %.2f MB",
           ((auVar13._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0) +
           (auVar12._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0) + 32.0) *
           9.5367431640625e-07);
    if (p->nCoarse != 0) {
      printf("   Coarse = %d (%.1f %%)",((double)p->nCoarse * 100.0) / (double)p->pGia->nObjs);
    }
    putchar(10);
    fflush(_stdout);
  }
  return;
}

Assistant:

void Jf_ManComputeCuts( Jf_Man_t * p, int fEdge )
{
    Gia_Obj_t * pObj; int i;
    if ( p->pPars->fVerbose )
    {
        printf( "Aig: CI = %d  CO = %d  AND = %d    ", Gia_ManCiNum(p->pGia), Gia_ManCoNum(p->pGia), Gia_ManAndNum(p->pGia) );
        printf( "LutSize = %d  CutMax = %d  Rounds = %d\n", p->pPars->nLutSize, p->pPars->nCutNum, p->pPars->nRounds );
        printf( "Computing cuts...\r" );
        fflush( stdout );
    }
    Gia_ManForEachObj( p->pGia, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) || Gia_ObjIsBuf(pObj) )
            Jf_ObjAssignCut( p, pObj );
        if ( Gia_ObjIsBuf(pObj) )
            Jf_ObjPropagateBuf( p, pObj, 0 );
        else if ( Gia_ObjIsAnd(pObj) )
            Jf_ObjComputeCuts( p, pObj, fEdge );
    }
    if ( p->pPars->fVerbose )
    {
        printf( "CutPair = %lu  ", (long)p->CutCount[0] );
        printf( "Merge = %lu  ",   (long)p->CutCount[1] );
        printf( "Eval = %lu  ",    (long)p->CutCount[2] );
        printf( "Cut = %lu  ",     (long)p->CutCount[3] );
        Abc_PrintTime( 1, "Time",  Abc_Clock() - p->clkStart );
        printf( "Memory:  " );
        printf( "Gia = %.2f MB  ", Gia_ManMemory(p->pGia) / (1<<20) );
        printf( "Man = %.2f MB  ", 6.0 * sizeof(int) * Gia_ManObjNum(p->pGia) / (1<<20) );
        printf( "Cuts = %.2f MB",  Vec_ReportMemory(&p->pMem) / (1<<20) );
        if ( p->nCoarse )
        printf( "   Coarse = %d (%.1f %%)",  p->nCoarse, 100.0 * p->nCoarse / Gia_ManObjNum(p->pGia) );
        printf( "\n" );
        fflush( stdout );
    }
}